

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O1

void banner(FILE *stream)

{
  undefined8 uVar1;
  
  uVar1 = ASDCP::Version();
  fprintf((FILE *)stream,
          "\n%s (asdcplib %s)\n\nCopyright (c) 2003-2018 John Hurst\n\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
          ,"asdcp-wrap",uVar1,"asdcp-wrap");
  return;
}

Assistant:

void
banner(FILE* stream = stdout)
{
  fprintf(stream, "\n\
%s (asdcplib %s)\n\n\
Copyright (c) 2003-2018 John Hurst\n\n\
asdcplib may be copied only under the terms of the license found at\n\
the top of every file in the asdcplib distribution kit.\n\n\
Specify the -h (help) option for further information about %s\n\n",
	  PROGRAM_NAME, ASDCP::Version(), PROGRAM_NAME);
}